

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void cmGhsMultiTargetGenerator::WriteObjectLangOverride(ostream *fout,cmSourceFile *sourceFile)

{
  bool bVar1;
  char *__s;
  string *__rhs;
  ostream *this;
  string *extension;
  undefined1 local_78 [8];
  string sourceLangProp;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *rawLangProp;
  cmSourceFile *sourceFile_local;
  ostream *fout_local;
  
  rawLangProp = (char *)sourceFile;
  sourceFile_local = (cmSourceFile *)fout;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"LANGUAGE",&local_41);
  __s = cmSourceFile::GetProperty(sourceFile,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (__s != (char *)0x0) {
    local_20 = __s;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,__s,(allocator<char> *)((long)&extension + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&extension + 7));
    __rhs = cmSourceFile::GetExtension_abi_cxx11_((cmSourceFile *)rawLangProp);
    bVar1 = std::operator==("CXX",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_78);
    if ((bVar1) &&
       ((bVar1 = std::operator==("c",__rhs), bVar1 || (bVar1 = std::operator==("C",__rhs), bVar1))))
    {
      this = std::operator<<((ostream *)sourceFile_local,"    -dotciscxx");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteObjectLangOverride(
  std::ostream& fout, const cmSourceFile* sourceFile)
{
  const char* rawLangProp = sourceFile->GetProperty("LANGUAGE");
  if (nullptr != rawLangProp) {
    std::string sourceLangProp(rawLangProp);
    std::string const& extension = sourceFile->GetExtension();
    if ("CXX" == sourceLangProp && ("c" == extension || "C" == extension)) {
      fout << "    -dotciscxx" << std::endl;
    }
  }
}